

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall
QFileDialogPrivate::fileRenamed
          (QFileDialogPrivate *this,QString *path,QString *oldName,QString *newName)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QString local_68;
  QArrayData *local_50;
  char16_t *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QFileDialogOptions::fileMode();
  if (iVar2 != 2) goto LAB_004e87de;
  if (this->model == (QFileSystemModel *)0x0) {
    local_50 = (QArrayData *)0x0;
    local_48 = L"/";
    local_40 = 1;
  }
  else {
    QFileSystemModel::rootPath();
  }
  if ((path->d).size == local_40) {
    QVar3.m_data = (path->d).ptr;
    QVar3.m_size = local_40;
    QVar5.m_data = local_48;
    QVar5.m_size = local_40;
    cVar1 = QtPrivate::equalStrings(QVar3,QVar5);
    if (cVar1 == '\0') goto LAB_004e879e;
    QLineEdit::text(&local_68,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
    if (local_68.d.size == (oldName->d).size) {
      QVar4.m_data = local_68.d.ptr;
      QVar4.m_size = local_68.d.size;
      QVar6.m_data = (oldName->d).ptr;
      QVar6.m_size = local_68.d.size;
      cVar1 = QtPrivate::equalStrings(QVar4,QVar6);
    }
    else {
      cVar1 = '\0';
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
LAB_004e879e:
    cVar1 = '\0';
  }
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (cVar1 != '\0') {
    QLineEdit::setText(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,newName);
  }
LAB_004e87de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::fileRenamed(const QString &path, const QString &oldName, const QString &newName)
{
    const QFileDialog::FileMode fileMode = q_func()->fileMode();
    if (fileMode == QFileDialog::Directory) {
        if (path == rootPath() && lineEdit()->text() == oldName)
            lineEdit()->setText(newName);
    }
}